

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAPropBag.cpp
# Opt level: O1

void Js::SCAPropBag::CreateInstance(ScriptContext *scriptContext,SCAPropBag **ppInstance)

{
  HeapAllocator *alloc;
  SCAPropBag *this;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  local_50 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_ad68f1c;
  data.filename._0_4_ = 0x26;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_50);
  this = (SCAPropBag *)new<Memory::HeapAllocator>(0x20,alloc,0x300d4a);
  SCAPropBag(this,scriptContext);
  *ppInstance = this;
  return;
}

Assistant:

void SCAPropBag::CreateInstance(ScriptContext* scriptContext, SCAPropBag** ppInstance)
    {
        *ppInstance = HeapNew(SCAPropBag, scriptContext);
    }